

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

bool __thiscall cmCTestHG::LoadRevisions(cmCTestHG *this)

{
  undefined1 local_2c0 [8];
  OutputLogger err;
  LogParser out;
  char *hg_log [8];
  char *hgXMLTemplate;
  char *hg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string range;
  cmCTestHG *this_local;
  
  range.field_2._8_8_ = this;
  std::operator+(&local_50,&(this->super_cmCTestGlobalVC).OldRevision,":");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,&(this->super_cmCTestGlobalVC).NewRevision);
  std::__cxx11::string::~string((string *)&local_50);
  out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
       std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  LogParser::LogParser((LogParser *)&err.super_LineParser.Separator,this,"log-out> ");
  cmProcessTools::OutputParser::Process
            ((OutputParser *)&err.super_LineParser.Separator,"<?xml version=\"1.0\"?>\n<log>\n");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_2c0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> "
            );
  cmCTestVC::RunChild((cmCTestVC *)this,
                      (char **)&out.CData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                field_0x10,(OutputParser *)&err.super_LineParser.Separator,
                      (OutputParser *)local_2c0,(char *)0x0,Auto);
  cmProcessTools::OutputParser::Process((OutputParser *)&err.super_LineParser.Separator,"</log>\n");
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_2c0);
  LogParser::~LogParser((LogParser *)&err.super_LineParser.Separator);
  std::__cxx11::string::~string((string *)local_30);
  return true;
}

Assistant:

bool cmCTestHG::LoadRevisions()
{
  // Use 'hg log' to get revisions in a xml format.
  //
  // TODO: This should use plumbing or python code to be more precise.
  // The "list of strings" templates like {files} will not work when
  // the project has spaces in the path.  Also, they may not have
  // proper XML escapes.
  std::string range = this->OldRevision + ":" + this->NewRevision;
  const char* hg = this->CommandLineTool.c_str();
  const char* hgXMLTemplate = "<logentry\n"
                              "   revision=\"{node|short}\">\n"
                              "  <author>{author|person}</author>\n"
                              "  <email>{author|email}</email>\n"
                              "  <date>{date|isodate}</date>\n"
                              "  <msg>{desc}</msg>\n"
                              "  <files>{files}</files>\n"
                              "  <file_adds>{file_adds}</file_adds>\n"
                              "  <file_dels>{file_dels}</file_dels>\n"
                              "</logentry>\n";
  const char* hg_log[] = {
    hg,           "log",         "--removed", "-r", range.c_str(),
    "--template", hgXMLTemplate, CM_NULLPTR
  };

  LogParser out(this, "log-out> ");
  out.Process("<?xml version=\"1.0\"?>\n"
              "<log>\n");
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(hg_log, &out, &err);
  out.Process("</log>\n");
  return true;
}